

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O2

int64_t av1_block_error_avx2(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  
  lVar4 = 0;
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  auVar10 = ZEXT1664((undefined1  [16])0x0);
  while( true ) {
    auVar9 = auVar10._0_32_;
    auVar7 = auVar8._0_32_;
    if (block_size <= lVar4) break;
    auVar6 = vpackssdw_avx2(*(undefined1 (*) [32])(coeff + lVar4),
                            *(undefined1 (*) [32])(coeff + lVar4 + 8));
    auVar11 = vpackssdw_avx2(*(undefined1 (*) [32])(dqcoeff + lVar4),
                             *(undefined1 (*) [32])(dqcoeff + lVar4 + 8));
    auVar3 = vpermq_avx2(auVar6,0xd8);
    auVar6 = vpsubw_avx2(auVar11,auVar6);
    auVar6 = vpermq_avx2(auVar6,0xd8);
    auVar6 = vpmaddwd_avx2(auVar6,auVar6);
    auVar11 = vpmaddwd_avx2(auVar3,auVar3);
    auVar5 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar3 = vpunpckldq_avx2(auVar6,auVar5);
    auVar6 = vpunpckhdq_avx2(auVar6,auVar5);
    auVar2 = vpunpckldq_avx2(auVar11,auVar5);
    auVar11 = vpunpckhdq_avx2(auVar11,auVar5);
    auVar9 = vpaddq_avx2(auVar9,auVar3);
    auVar9 = vpaddq_avx2(auVar9,auVar6);
    auVar10 = ZEXT3264(auVar9);
    auVar7 = vpaddq_avx2(auVar7,auVar2);
    auVar7 = vpaddq_avx2(auVar7,auVar11);
    auVar8 = ZEXT3264(auVar7);
    lVar4 = lVar4 + 0x10;
  }
  auVar6 = vpsrldq_avx2(auVar9,8);
  auVar11 = vpsrldq_avx2(auVar7,8);
  auVar9 = vpaddq_avx2(auVar9,auVar6);
  auVar7 = vpaddq_avx2(auVar7,auVar11);
  auVar1 = vpaddq_avx(auVar7._0_16_,auVar7._16_16_);
  *ssz = auVar1._0_8_;
  auVar1 = vpaddq_avx(auVar9._0_16_,auVar9._16_16_);
  return auVar1._0_8_;
}

Assistant:

int64_t av1_block_error_avx2(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                             intptr_t block_size, int64_t *ssz) {
  __m256i sse_reg, ssz_reg, coeff_reg, dqcoeff_reg;
  __m256i exp_dqcoeff_lo, exp_dqcoeff_hi, exp_coeff_lo, exp_coeff_hi;
  __m256i sse_reg_64hi, ssz_reg_64hi;
  __m128i sse_reg128, ssz_reg128;
  int64_t sse;
  int i;
  const __m256i zero_reg = _mm256_setzero_si256();

  // init sse and ssz registerd to zero
  sse_reg = _mm256_setzero_si256();
  ssz_reg = _mm256_setzero_si256();

  for (i = 0; i < block_size; i += 16) {
    // load 32 bytes from coeff and dqcoeff
    read_coeff(coeff, i, &coeff_reg);
    read_coeff(dqcoeff, i, &dqcoeff_reg);
    // dqcoeff - coeff
    dqcoeff_reg = _mm256_sub_epi16(dqcoeff_reg, coeff_reg);
    // madd (dqcoeff - coeff)
    dqcoeff_reg = _mm256_madd_epi16(dqcoeff_reg, dqcoeff_reg);
    // madd coeff
    coeff_reg = _mm256_madd_epi16(coeff_reg, coeff_reg);
    // expand each double word of madd (dqcoeff - coeff) to quad word
    exp_dqcoeff_lo = _mm256_unpacklo_epi32(dqcoeff_reg, zero_reg);
    exp_dqcoeff_hi = _mm256_unpackhi_epi32(dqcoeff_reg, zero_reg);
    // expand each double word of madd (coeff) to quad word
    exp_coeff_lo = _mm256_unpacklo_epi32(coeff_reg, zero_reg);
    exp_coeff_hi = _mm256_unpackhi_epi32(coeff_reg, zero_reg);
    // add each quad word of madd (dqcoeff - coeff) and madd (coeff)
    sse_reg = _mm256_add_epi64(sse_reg, exp_dqcoeff_lo);
    ssz_reg = _mm256_add_epi64(ssz_reg, exp_coeff_lo);
    sse_reg = _mm256_add_epi64(sse_reg, exp_dqcoeff_hi);
    ssz_reg = _mm256_add_epi64(ssz_reg, exp_coeff_hi);
  }
  // save the higher 64 bit of each 128 bit lane
  sse_reg_64hi = _mm256_srli_si256(sse_reg, 8);
  ssz_reg_64hi = _mm256_srli_si256(ssz_reg, 8);
  // add the higher 64 bit to the low 64 bit
  sse_reg = _mm256_add_epi64(sse_reg, sse_reg_64hi);
  ssz_reg = _mm256_add_epi64(ssz_reg, ssz_reg_64hi);

  // add each 64 bit from each of the 128 bit lane of the 256 bit
  sse_reg128 = _mm_add_epi64(_mm256_castsi256_si128(sse_reg),
                             _mm256_extractf128_si256(sse_reg, 1));

  ssz_reg128 = _mm_add_epi64(_mm256_castsi256_si128(ssz_reg),
                             _mm256_extractf128_si256(ssz_reg, 1));

  // store the results
  _mm_storel_epi64((__m128i *)(&sse), sse_reg128);

  _mm_storel_epi64((__m128i *)(ssz), ssz_reg128);
  _mm256_zeroupper();
  return sse;
}